

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

void __thiscall wasm::LocalGetCounter::~LocalGetCounter(LocalGetCounter *this)

{
  LocalGetCounter *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->num);
  PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::~PostWalker
            (&this->
              super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>);
  return;
}

Assistant:

LocalGetCounter() = default;